

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool (anonymous_namespace)::miniz::mz_zip_writer_validate_archive_name(char *pArchive_name)

{
  char *pArchive_name_local;
  mz_bool local_4;
  
  pArchive_name_local = pArchive_name;
  if (*pArchive_name == '/') {
    local_4 = 0;
  }
  else {
    for (; *pArchive_name_local != '\0'; pArchive_name_local = pArchive_name_local + 1) {
      if ((*pArchive_name_local == '\\') || (*pArchive_name_local == ':')) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static mz_bool mz_zip_writer_validate_archive_name(const char *pArchive_name) {
  // Basic ZIP archive filename validity checks: Valid filenames cannot start
  // with a forward slash, cannot contain a drive letter, and cannot use
  // DOS-style backward slashes.
  if (*pArchive_name == '/')
    return MZ_FALSE;
  while (*pArchive_name) {
    if ((*pArchive_name == '\\') || (*pArchive_name == ':'))
      return MZ_FALSE;
    pArchive_name++;
  }
  return MZ_TRUE;
}